

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::LocalDeclStatement(SQCompiler *this)

{
  SQLexer *this_00;
  bool bVar1;
  SQInteger SVar2;
  SQUnsignedInteger stkpos;
  SQUnsignedInteger SVar3;
  SQFuncState *pSVar4;
  byte bVar5;
  SQObject SVar6;
  SQInstruction local_48;
  SQObject local_40;
  
  this_00 = &this->_lex;
  SVar2 = SQLexer::Lex(this_00);
  this->_token = SVar2;
  if (SVar2 == 0x11d) {
    SVar2 = SQLexer::Lex(this_00);
    this->_token = SVar2;
    SVar6 = Expect(this,0x102);
    local_40._unVal = SVar6._unVal;
    local_40._type = SVar6._type;
    bVar5 = 0xff;
    if (this->_token == 0x5b) {
      SVar2 = ParseBindEnv(this);
      bVar5 = (byte)SVar2;
    }
    Expect(this,0x28);
    CreateFunction(this,&local_40,0xff,false);
    pSVar4 = this->_fs;
    SVar2 = SQFuncState::PushTarget(pSVar4,-1);
    local_48.op = '0';
    local_48._arg0 = (uchar)SVar2;
    local_48._arg1 = (int)(this->_fs->_functions)._size + -1;
    local_48._arg3 = '\0';
    local_48._arg2 = bVar5;
    SQFuncState::AddInstruction(pSVar4,&local_48);
    SQFuncState::PopTarget(this->_fs);
    SQFuncState::PushLocalVariable(this->_fs,&local_40);
    return;
  }
  do {
    SVar6 = Expect(this,0x102);
    local_40._unVal = SVar6._unVal;
    local_40._type = SVar6._type;
    if (this->_token == 0x3d) {
      SVar2 = SQLexer::Lex(this_00);
      this->_token = SVar2;
      Expression(this);
      stkpos = SQFuncState::PopTarget(this->_fs);
      SVar3 = SQFuncState::PushTarget(this->_fs,-1);
      if (SVar3 != stkpos) {
        bVar1 = SQFuncState::IsLocal(this->_fs,stkpos);
        pSVar4 = this->_fs;
        if (bVar1) {
          pSVar4->_optimization = false;
        }
        local_48.op = '\n';
        local_48._arg0 = (uchar)SVar3;
        local_48._arg1 = (SQInt32)stkpos;
        goto LAB_0011c3cc;
      }
    }
    else {
      pSVar4 = this->_fs;
      SVar2 = SQFuncState::PushTarget(pSVar4,-1);
      local_48.op = '\x18';
      local_48._arg0 = (uchar)SVar2;
      local_48._arg1 = 1;
LAB_0011c3cc:
      local_48._arg2 = '\0';
      local_48._arg3 = '\0';
      SQFuncState::AddInstruction(pSVar4,&local_48);
    }
    SQFuncState::PopTarget(this->_fs);
    SQFuncState::PushLocalVariable(this->_fs,&local_40);
    if (this->_token != 0x2c) {
      return;
    }
    SVar2 = SQLexer::Lex(this_00);
    this->_token = SVar2;
  } while( true );
}

Assistant:

void LocalDeclStatement()
    {
        SQObject varname;
        Lex();
        if( _token == TK_FUNCTION) {
			SQInteger boundtarget = 0xFF;
            Lex();
			varname = Expect(TK_IDENTIFIER);
			if (_token == _SC('[')) {
				boundtarget = ParseBindEnv();
			}
            Expect(_SC('('));
            CreateFunction(varname,0xFF,false);
            _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, boundtarget);
            _fs->PopTarget();
            _fs->PushLocalVariable(varname);
            return;
        }

        do {
            varname = Expect(TK_IDENTIFIER);
            if(_token == _SC('=')) {
                Lex(); Expression();
                SQInteger src = _fs->PopTarget();
                SQInteger dest = _fs->PushTarget();
                if (dest != src) {
                    if (_fs->IsLocal(src)) {
                        _fs->SnoozeOpt();
                    }
                    _fs->AddInstruction(_OP_MOVE, dest, src);
                }
            }
            else{
                _fs->AddInstruction(_OP_LOADNULLS, _fs->PushTarget(),1);
            }
            _fs->PopTarget();
            _fs->PushLocalVariable(varname);
            if(_token == _SC(',')) Lex(); else break;
        } while(1);
    }